

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::VarCasted::VarCasted(VarCasted *this,Var *parent,VarCastType cast_type)

{
  initializer_list<const_kratos::IRNode_*> __l;
  int iVar1;
  uint32_t var_width;
  VarType type;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  size_type sVar4;
  reference pvVar5;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  string_view format_str;
  format_args args;
  allocator<const_kratos::IRNode_*> local_171;
  Var *local_170;
  Var **local_168;
  size_type local_160;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_158;
  char local_140 [32];
  string local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  allocator<char> local_d1;
  string local_d0;
  VarCastType local_ac;
  Var *pVStack_a8;
  VarCastType cast_type_local;
  Var *parent_local;
  VarCasted *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs;
  char (*local_48) [61];
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_10;
  
  local_ac = cast_type;
  pVStack_a8 = parent;
  parent_local = &this->super_Var;
  iVar1 = (*(parent->super_IRNode)._vptr_IRNode[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
  var_width = (*(pVStack_a8->super_IRNode)._vptr_IRNode[7])();
  pvVar2 = Var::size(pVStack_a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_100,pvVar2);
  type = Var::type(pVStack_a8);
  pvVar2 = &local_100;
  aVar6.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar1),&local_d0,var_width,pvVar2,
           false,type);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_100);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  EnumType::EnumType(&this->super_EnumType);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005b5728;
  (this->super_EnumType)._vptr_EnumType = (_func_int **)&DAT_005b5898;
  this->parent_var_ = pVStack_a8;
  this->cast_type_ = local_ac;
  this->enum_type_ = (Enum *)0x0;
  this->target_width_ = 0;
  (this->super_Var).type_ = BaseCasted;
  if (this->cast_type_ == Signed) {
    (this->super_Var).is_signed_ = true;
  }
  else if (this->cast_type_ == Unsigned) {
    (this->super_Var).is_signed_ = false;
  }
  else if ((this->cast_type_ == AsyncReset) || (this->cast_type_ == Clock)) {
    pvVar3 = Var::size(pVStack_a8);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
    if (sVar4 == 1) {
      pvVar3 = Var::size(pVStack_a8);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar3);
      if (*pvVar5 == 1) {
        return;
      }
    }
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    (*(pVStack_a8->super_IRNode)._vptr_IRNode[0x1f])(local_140);
    pvVar3 = Var::size(pVStack_a8);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar3);
    local_38 = &local_120;
    local_40 = "Can only cast bit width 1 to Clock or AsyncReset. {0} is {1}";
    local_48 = (char (*) [61])local_140;
    fmt::v7::make_args_checked<std::__cxx11::string,unsigned_int&,char[61],char>
              (&local_78,(v7 *)"Can only cast bit width 1 to Clock or AsyncReset. {0} is {1}",
               local_48,(remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,
               (remove_reference_t<unsigned_int_&> *)pvVar2);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x2d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar6.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_120,(detail *)local_88.data_,format_str,args);
    local_170 = pVStack_a8;
    local_168 = &local_170;
    local_160 = 1;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_171);
    __l._M_len = local_160;
    __l._M_array = (iterator)local_168;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_158,__l,&local_171);
    VarException::VarException(this_00,&local_120,&local_158);
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  return;
}

Assistant:

VarCasted::VarCasted(Var *parent, VarCastType cast_type)
    : Var(parent->generator(), "", parent->width(), parent->size(), false, parent->type()),
      parent_var_(parent),
      cast_type_(cast_type) {
    type_ = VarType::BaseCasted;
    if (cast_type_ == VarCastType::Signed) {
        is_signed_ = true;
    } else if (cast_type_ == VarCastType::Unsigned) {
        is_signed_ = false;
    } else if (cast_type_ == VarCastType::AsyncReset || cast_type_ == VarCastType::Clock) {
        if (parent->size().size() != 1 || parent->size().front() != 1) {
            throw VarException(::format("Can only cast bit width 1 to "
                                        "Clock or AsyncReset. {0} is {1}",
                                        parent->to_string(), parent->size().front()),
                               {parent});
        }
    }
}